

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationSurfaceOccurrence::~IfcAnnotationSurfaceOccurrence
          (IfcAnnotationSurfaceOccurrence *this)

{
  pointer pcVar1;
  void *pvVar2;
  
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem = 0x9c0080;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).field_0x90 = 0x9c00d0;
  (this->super_IfcAnnotationOccurrence).super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x9c00a8;
  pcVar1 = (this->super_IfcAnnotationOccurrence).super_IfcStyledItem.Name.ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.Name.ptr.field_2) {
    operator_delete(pcVar1);
  }
  pvVar2 = *(void **)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x20;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcAnnotationSurfaceOccurrence() : Object("IfcAnnotationSurfaceOccurrence") {}